

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

void anon_unknown.dwarf_3ea68::writeSymbolMap(Module *wasm,string *filename)

{
  PassRunner local_2c8 [8];
  PassRunner runner;
  PassOptions local_1d8;
  PassOptions local_120;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_40 [39];
  allocator<char> local_19;
  
  local_120.arguments._M_h._M_buckets = &local_120.arguments._M_h._M_single_bucket;
  local_120.debug = false;
  local_120.validate = true;
  local_120.validateGlobally = true;
  local_120.optimizeLevel = 0;
  local_120.shrinkLevel = 0;
  local_120.inlining.alwaysInlineMaxSize = 2;
  local_120.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_120.inlining.flexibleInlineMaxSize = 0x14;
  local_120.inlining.allowFunctionsWithLoops = false;
  local_120.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_120.targetJS = false;
  local_120.inlining.partialInliningIfs = 0;
  local_120.ignoreImplicitTraps = false;
  local_120.trapsNeverHappen = false;
  local_120.lowMemoryUnused = false;
  local_120.fastMath = false;
  local_120.zeroFilledMemory = false;
  local_120.closedWorld = false;
  local_120.debugInfo = false;
  local_120.generateStackIR = false;
  local_120.optimizeStackIR = false;
  local_120.arguments._M_h._M_bucket_count = 1;
  local_120.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120.arguments._M_h._M_element_count = 0;
  local_120.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_120.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_120.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_120.passesToSkip._M_h._M_buckets = &local_120.passesToSkip._M_h._M_single_bucket;
  local_120.passesToSkip._M_h._M_bucket_count = 1;
  local_120.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120.passesToSkip._M_h._M_element_count = 0;
  local_120.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_120.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_120.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::wasm::PassOptions::PassOptions(&local_1d8,&local_120);
  ::wasm::PassRunner::PassRunner(local_2c8,wasm,&local_1d8);
  ::wasm::PassOptions::~PassOptions(&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"symbolmap",&local_19);
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
            ((_Optional_payload_base<std::__cxx11::string> *)&local_68,filename);
  ::wasm::PassRunner::add(local_2c8,local_40,&local_68);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_68);
  std::__cxx11::string::~string(local_40);
  ::wasm::PassRunner::run();
  ::wasm::PassRunner::~PassRunner(local_2c8);
  ::wasm::PassOptions::~PassOptions(&local_120);
  return;
}

Assistant:

void writeSymbolMap(Module& wasm, std::string filename) {
  PassOptions options;
  PassRunner runner(&wasm, options);
  runner.add("symbolmap", filename);
  runner.run();
}